

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::do_remove(tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            *this,key_type k,bool bypass_verifier)

{
  bool bVar1;
  __atomic_base<long> _Var2;
  undefined7 in_register_00000009;
  __extent_storage<18446744073709551615UL> val1;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_5UL>_> *this_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  char *pcVar4;
  key_type key;
  span<const_std::byte,_18446744073709551615UL> key_00;
  __int_type_conflict key_prefix_splits_before;
  undefined1 local_108 [8];
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_5UL>_> node_counts_before;
  AssertHelper local_d8;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> shrinking_inodes_before;
  __int_type_conflict mem_use_before;
  Message local_a8;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> growing_inodes_before;
  __atomic_base<long> local_80;
  size_type remove_result;
  __atomic_base<unsigned_long> local_58;
  __int_type_conflict mem_use_after;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  __int_type_conflict leaf_count_after;
  
  key_00._M_ptr = k._M_extent._M_extent_value;
  if ((int)CONCAT71(in_register_00000009,bypass_verifier) == 0) {
    key._M_extent._M_extent_value = (size_t)k._M_ptr;
    key._M_ptr = (pointer)this;
    to_ikey((tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             *)local_108,key);
    _Var2._M_i = std::
                 _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ::erase(&(this->values)._M_t,(key_type *)local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&node_counts_before);
    local_a8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 1;
    local_80._M_i = _Var2._M_i;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_108,"(remove_result)","(1)",(unsigned_long *)&local_80,
               (int *)&local_a8);
    if (local_108[0] != (internal)0x0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&node_counts_before);
      goto LAB_0013211a;
    }
    testing::Message::Message(&local_a8);
    if (node_counts_before._M_elems[0] == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)node_counts_before._M_elems[0];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x121,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d8,&local_a8);
    this_00 = &node_counts_before;
LAB_0013246c:
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(local_a8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_,
                  local_a8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._0_4_);
  }
  else {
LAB_0013211a:
    node_counts_before._M_elems[4] = (unsigned_long)&(this->test_db).node_counts;
    unodb::detail::copy_atomic_to_nonatomic<std::array<std::atomic<unsigned_long>,5ul>const>
              ((array<std::atomic<unsigned_long>,_5UL> *)node_counts_before._M_elems[4]);
    shrinking_inodes_before._M_elems[3] =
         (this->test_db).current_memory_use.super___atomic_base<unsigned_long>._M_i;
    local_a8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)&local_80,"(node_counts_before[as_i<unodb::node_type::LEAF>])","(0)",
               (unsigned_long *)local_108,(int *)&local_a8);
    if (local_80._M_i._0_1_ == (internal)0x0) {
      testing::Message::Message(&local_a8);
      if (remove_result == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x127,pcVar4);
      testing::internal::AssertHelper::operator=(&local_d8,&local_a8);
LAB_00132468:
      this_00 = (non_atomic_array<const_std::array<std::atomic<unsigned_long>,_5UL>_> *)
                &remove_result;
      goto LAB_0013246c;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&remove_result);
    local_a8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    val1._M_extent_value = (size_t)(shrinking_inodes_before._M_elems + 3);
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)&local_80,"(mem_use_before)","(0)",(unsigned_long *)val1._M_extent_value,
               (int *)&local_a8);
    if (local_80._M_i._0_1_ == (internal)0x0) {
      testing::Message::Message(&local_a8);
      if (remove_result == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x128,pcVar4);
      testing::internal::AssertHelper::operator=(&local_d8,&local_a8);
      goto LAB_00132468;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&remove_result);
    unodb::detail::copy_atomic_to_nonatomic<std::array<std::atomic<unsigned_long>,4ul>const>
              (&(this->test_db).growing_inode_counts);
    unodb::detail::copy_atomic_to_nonatomic<std::array<std::atomic<unsigned_long>,4ul>const>
              (&(this->test_db).shrinking_inode_counts);
    bVar1 = olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
            ::remove_internal(&this->test_db,(art_key_type)k);
    if (!bVar1) {
      std::operator<<((ostream *)&std::cerr,"test_db.remove failed for ");
      key_00._M_extent._M_extent_value = val1._M_extent_value;
      unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
                ((detail *)&std::cerr,(ostream *)k._M_ptr,key_00);
      std::operator<<((ostream *)&std::cerr,'\n');
      olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
      ::dump(&this->test_db,(ostream *)&std::cerr);
      testing::Message::Message((Message *)&local_80);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x135,"Failed");
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
      if ((long *)local_80._M_i == (long *)0x0) {
        return;
      }
      (**(code **)(*(long *)local_80._M_i + 8))();
      return;
    }
    if (this->parallel_test != false) {
      return;
    }
    local_58._M_i = (this->test_db).current_memory_use.super___atomic_base<unsigned_long>._M_i;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_80,"(mem_use_after)","(mem_use_before)",&local_58._M_i,
               shrinking_inodes_before._M_elems + 3);
    if (local_80._M_i._0_1_ != (internal)0x0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&remove_result);
      local_40._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            node_counts_before._M_elems[4];
      growing_inodes_before._M_elems[3] = CONCAT71(local_108._1_7_,local_108[0]) - 1;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_80,"(leaf_count_after)",
                 "(node_counts_before[as_i<unodb::node_type::LEAF>] - 1)",(unsigned_long *)&local_40
                 ,growing_inodes_before._M_elems + 3);
      if (local_80._M_i._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)(growing_inodes_before._M_elems + 3));
        if (remove_result == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)remove_result;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mem_use_before,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x151,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mem_use_before,(Message *)(growing_inodes_before._M_elems + 3));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem_use_before);
        if (growing_inodes_before._M_elems[3] != 0) {
          (**(code **)(*(long *)growing_inodes_before._M_elems[3] + 8))();
        }
      }
      this_00 = (non_atomic_array<const_std::array<std::atomic<unsigned_long>,_5UL>_> *)
                &remove_result;
      goto LAB_0013248d;
    }
    testing::Message::Message((Message *)&local_40);
    if (remove_result == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)remove_result;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(growing_inodes_before._M_elems + 3),kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x14c,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(growing_inodes_before._M_elems + 3),(Message *)&local_40);
    this_00 = (non_atomic_array<const_std::array<std::atomic<unsigned_long>,_5UL>_> *)&remove_result
    ;
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(growing_inodes_before._M_elems + 3));
    _Var3._M_head_impl = local_40._M_head_impl;
  }
  if (_Var3._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))();
  }
LAB_0013248d:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  return;
}

Assistant:

void do_remove(key_type k, bool bypass_verifier) {
    if (!bypass_verifier) {
      const auto remove_result = values.erase(to_ikey(k));
      UNODB_ASSERT_EQ(remove_result, 1);
    }

#ifdef UNODB_DETAIL_WITH_STATS
    const auto node_counts_before = test_db.get_node_counts();
    const auto mem_use_before = test_db.get_current_memory_use();
    UNODB_ASSERT_GT(node_counts_before[as_i<unodb::node_type::LEAF>], 0);
    UNODB_ASSERT_GT(mem_use_before, 0);
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      if (!test_db.remove(k)) {
        // LCOV_EXCL_START
        std::cerr << "test_db.remove failed for ";
        unodb::detail::dump_key(std::cerr, k);
        std::cerr << '\n';
        test_db.dump(std::cerr);
        FAIL();
        // LCOV_EXCL_STOP
      }
    } catch (...) {
#ifdef UNODB_DETAIL_WITH_STATS
      if (!parallel_test) {
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
      }
#endif  // UNODB_DETAIL_WITH_STATS
      throw;
    }

#ifdef UNODB_DETAIL_WITH_STATS
    if (!parallel_test) {
      const auto mem_use_after = test_db.get_current_memory_use();
      UNODB_ASSERT_LT(mem_use_after, mem_use_before);

      const auto leaf_count_after =
          test_db.template get_node_count<::unodb::node_type::LEAF>();
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] - 1);
    }
#endif  // UNODB_DETAIL_WITH_STATS
  }